

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool node::anon_unknown_2::FillBlock
               (CBlockIndex *index,FoundBlock *block,
               UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *lock,CChain *active,
               BlockManager *blockman)

{
  uint256 *puVar1;
  bool bVar2;
  int64_t iVar3;
  CBlockIndex *pCVar4;
  long in_FS_OFFSET;
  reverse_lock revlock26;
  undefined1 local_98 [24];
  _Alloc_hider _Stack_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (index != (CBlockIndex *)0x0) {
    if (block->m_hash != (uint256 *)0x0) {
      CBlockIndex::GetBlockHash((uint256 *)local_98,index);
      puVar1 = block->m_hash;
      *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10) = local_98._16_8_;
      *(pointer *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18) = _Stack_80._M_p;
      *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems = local_98._0_8_;
      *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8) = local_98._8_8_;
    }
    if (block->m_height != (int *)0x0) {
      *block->m_height = index->nHeight;
    }
    if ((ulong *)block->m_time != (ulong *)0x0) {
      *block->m_time = (ulong)index->nTime;
    }
    if ((ulong *)block->m_max_time != (ulong *)0x0) {
      *block->m_max_time = (ulong)index->nTimeMax;
    }
    if (block->m_mtp_time != (int64_t *)0x0) {
      iVar3 = CBlockIndex::GetMedianTimePast(index);
      *block->m_mtp_time = iVar3;
    }
    if (block->m_in_active_chain != (bool *)0x0) {
      pCVar4 = CChain::operator[](active,index->nHeight);
      *block->m_in_active_chain = pCVar4 == index;
    }
    if (block->m_locator != (CBlockLocator *)0x0) {
      GetLocator((CBlockLocator *)local_98,index);
      std::vector<uint256,_std::allocator<uint256>_>::_M_move_assign
                (&block->m_locator->vHave,local_98);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                ((_Vector_base<uint256,_std::allocator<uint256>_> *)local_98);
    }
    if (block->m_next_block != (FoundBlock *)0x0) {
      pCVar4 = CChain::operator[](active,index->nHeight);
      if (pCVar4 == index) {
        pCVar4 = CChain::operator[](active,index->nHeight + 1);
      }
      else {
        pCVar4 = (CBlockIndex *)0x0;
      }
      FillBlock(pCVar4,block->m_next_block,lock,active,blockman);
    }
    if (block->m_data != (CBlock *)0x0) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::reverse_lock::reverse_lock
                ((reverse_lock *)local_98,lock,"lock",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                 ,0x1b7);
      bVar2 = BlockManager::ReadBlockFromDisk(blockman,block->m_data,index);
      if (!bVar2) {
        CBlock::SetNull(block->m_data);
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::reverse_lock::~reverse_lock
                ((reverse_lock *)local_98);
    }
    block->found = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return index != (CBlockIndex *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool FillBlock(const CBlockIndex* index, const FoundBlock& block, UniqueLock<RecursiveMutex>& lock, const CChain& active, const BlockManager& blockman)
{
    if (!index) return false;
    if (block.m_hash) *block.m_hash = index->GetBlockHash();
    if (block.m_height) *block.m_height = index->nHeight;
    if (block.m_time) *block.m_time = index->GetBlockTime();
    if (block.m_max_time) *block.m_max_time = index->GetBlockTimeMax();
    if (block.m_mtp_time) *block.m_mtp_time = index->GetMedianTimePast();
    if (block.m_in_active_chain) *block.m_in_active_chain = active[index->nHeight] == index;
    if (block.m_locator) { *block.m_locator = GetLocator(index); }
    if (block.m_next_block) FillBlock(active[index->nHeight] == index ? active[index->nHeight + 1] : nullptr, *block.m_next_block, lock, active, blockman);
    if (block.m_data) {
        REVERSE_LOCK(lock);
        if (!blockman.ReadBlockFromDisk(*block.m_data, *index)) block.m_data->SetNull();
    }
    block.found = true;
    return true;
}